

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

void * __thiscall MemoryFootprintAllocator::fastMalloc(MemoryFootprintAllocator *this,size_t size)

{
  int iVar1;
  mapped_type *pmVar2;
  int *piVar3;
  mapped_type in_RSI;
  long in_RDI;
  void *ptr;
  MutexLockGuard g;
  void *ptr_1;
  Mutex *in_stack_ffffffffffffff88;
  MutexLockGuard *in_stack_ffffffffffffff90;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *pmVar4;
  key_type *in_stack_ffffffffffffffc8;
  int local_20;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *local_10 [2];
  
  ncnn::MutexLockGuard::MutexLockGuard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_10[0] = (map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                 *)0x0;
  iVar1 = posix_memalign(local_10,0x40,in_RSI + 0x40);
  if (iVar1 != 0) {
    local_10[0] = (map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                   *)0x0;
  }
  pmVar4 = local_10[0];
  pmVar2 = std::
           map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](local_10[0],in_stack_ffffffffffffffc8);
  *pmVar2 = in_RSI;
  local_20 = (int)in_RSI;
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + local_20;
  piVar3 = std::max<int>((int *)(in_RDI + 0xc),(int *)(in_RDI + 8));
  *(int *)(in_RDI + 0xc) = *piVar3;
  ncnn::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x19510f);
  return pmVar4;
}

Assistant:

virtual void* fastMalloc(size_t size)
    {
        ncnn::MutexLockGuard g(lock);
        void* ptr = ncnn::fastMalloc(size);
        bookkeeper[ptr] = size;
        current_memory_usage += size;
        memory_footprint = std::max(memory_footprint, current_memory_usage);
        return ptr;
    }